

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.h
# Opt level: O2

void throw_invalid_argument(char *msg)

{
  invalid_argument *this;
  
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,msg);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

inline void throw_invalid_argument(const char* msg) {

#ifndef IIR1_NO_EXCEPTIONS
    throw std::invalid_argument(msg);
#else
    (void) msg; // Discard parameter
    abort();
#endif

}